

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irStatement *
new_ir_seq(Context_conflict *ctx,MOJOSHADER_irStatement *first,MOJOSHADER_irStatement *next)

{
  MOJOSHADER_irSeq *retval;
  MOJOSHADER_irStatement *next_local;
  MOJOSHADER_irStatement *first_local;
  Context_conflict *ctx_local;
  
  if ((first == (MOJOSHADER_irStatement *)0x0) && (next == (MOJOSHADER_irStatement *)0x0)) {
    __assert_fail("(first != NULL) || (next != NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1285,
                  "MOJOSHADER_irStatement *new_ir_seq(Context *, MOJOSHADER_irStatement *, MOJOSHADER_irStatement *)"
                 );
  }
  ctx_local = (Context_conflict *)next;
  if ((first != (MOJOSHADER_irStatement *)0x0) &&
     (ctx_local = (Context_conflict *)first, next != (MOJOSHADER_irStatement *)0x0)) {
    ctx_local = (Context_conflict *)Malloc(ctx,0x28);
    if (ctx_local == (Context_conflict *)0x0) {
      ctx_local = (Context_conflict *)0x0;
    }
    else {
      ctx_local->isfail = 0x11;
      ctx_local->malloc = (MOJOSHADER_malloc)ctx->sourcefile;
      *(uint *)&ctx_local->free = ctx->sourceline;
      ctx_local->malloc_data = first;
      ctx_local->errors = (ErrorList *)next;
    }
  }
  return (MOJOSHADER_irStatement *)ctx_local;
}

Assistant:

static MOJOSHADER_irStatement *new_ir_seq(Context *ctx,
                                     MOJOSHADER_irStatement *first,
                                     MOJOSHADER_irStatement *next)
{
    assert((first != NULL) || (next != NULL));
    if (first == NULL)  // don't generate a SEQ if unnecessary.
        return next;
    else if (next == NULL)
        return first;

    NEW_IR_NODE(retval, MOJOSHADER_irSeq, MOJOSHADER_IR_SEQ);
    retval->first = first;
    retval->next = next;
    return (MOJOSHADER_irStatement *) retval;
}